

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

UChar * __thiscall
icu_63::Normalizer2Impl::findPreviousCompBoundary
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  uint16_t norm16_00;
  UChar *pUVar1;
  UChar *pUVar2;
  UBool UVar3;
  int local_54;
  int local_44;
  uint16_t __c2;
  int32_t __index;
  uint16_t norm16;
  UChar32 c;
  UChar *codePointLimit;
  UChar *pUStack_28;
  UBool onlyContiguous_local;
  UChar *p_local;
  UChar *start_local;
  Normalizer2Impl *this_local;
  
  pUStack_28 = p;
  while( true ) {
    pUVar2 = pUStack_28;
    if (pUStack_28 == start) {
      return pUStack_28;
    }
    pUVar1 = pUStack_28 + -1;
    __index = (int32_t)(ushort)pUStack_28[-1];
    if ((__index & 0xfffff800U) == 0xd800) {
      if ((((pUStack_28[-1] & 0x400U) == 0) || (pUVar1 == start)) ||
         ((pUStack_28[-2] & 0xfc00U) != 0xd800)) {
        local_44 = this->normTrie->dataLength + -1;
        pUStack_28 = pUVar1;
      }
      else {
        __index = (uint)(ushort)pUStack_28[-2] * 0x400 + __index + -0x35fdc00;
        if (__index < this->normTrie->highStart) {
          local_54 = ucptrie_internalSmallIndex_63(this->normTrie,__index);
        }
        else {
          local_54 = this->normTrie->dataLength + -2;
        }
        local_44 = local_54;
        pUStack_28 = pUStack_28 + -2;
      }
    }
    else {
      local_44 = (uint)this->normTrie->index[__index >> 6] + (__index & 0x3fU);
      pUStack_28 = pUVar1;
    }
    norm16_00 = *(uint16_t *)((long)(this->normTrie->data).ptr0 + (long)local_44 * 2);
    UVar3 = norm16HasCompBoundaryAfter(this,norm16_00,onlyContiguous);
    if (UVar3 != '\0') break;
    UVar3 = hasCompBoundaryBefore(this,__index,norm16_00);
    if (UVar3 != '\0') {
      return pUStack_28;
    }
  }
  return pUVar2;
}

Assistant:

const UChar *Normalizer2Impl::findPreviousCompBoundary(const UChar *start, const UChar *p,
                                                       UBool onlyContiguous) const {
    while (p != start) {
        const UChar *codePointLimit = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
        if (norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return codePointLimit;
        }
        if (hasCompBoundaryBefore(c, norm16)) {
            return p;
        }
    }
    return p;
}